

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_filename sqlite3_db_filename(sqlite3 *db,char *zDbName)

{
  Btree *p;
  char *pcVar1;
  
  p = sqlite3DbNameToBtree(db,zDbName);
  if (p != (Btree *)0x0) {
    pcVar1 = sqlite3BtreeGetFilename(p);
    return pcVar1;
  }
  return (sqlite3_filename)0x0;
}

Assistant:

SQLITE_API const char *sqlite3_db_filename(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeGetFilename(pBt) : 0;
}